

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPML_PCR_SELECTION_Unmarshal(&target->pcrSelect,buffer,size);
  if (TVar1 == 0) {
    TVar1 = TPM2B_DIGEST_Unmarshal(&target->pcrDigest,buffer,size);
    if (TVar1 == 0) {
      TVar1 = UINT8_Unmarshal((UINT8 *)&target->locality,buffer,size);
      if (TVar1 == 0) {
        TVar1 = UINT16_Unmarshal(&target->parentNameAlg,buffer,size);
        if (TVar1 == 0) {
          TVar1 = TPM2B_NAME_Unmarshal(&target->parentName,buffer,size);
          if (TVar1 == 0) {
            TVar1 = TPM2B_NAME_Unmarshal(&target->parentQualifiedName,buffer,size);
            if (TVar1 == 0) {
              TVar1 = TPM2B_DATA_Unmarshal(&target->outsideInfo,buffer,size);
              return TVar1;
            }
          }
        }
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPML_PCR_SELECTION_Unmarshal((TPML_PCR_SELECTION *)&(target->pcrSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->pcrDigest), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_LOCALITY_Unmarshal((TPMA_LOCALITY *)&(target->locality), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->parentNameAlg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentQualifiedName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->outsideInfo), buffer, size);
    return result;
}